

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
booster::locale::dngettext<char>(char *domain,char *s,char *p,int n,locale *loc)

{
  string *in_RSI;
  basic_message<char> *in_RDI;
  int in_stack_fffffffffffffeec;
  basic_message<char> *pbVar1;
  basic_message<char> *in_stack_ffffffffffffff00;
  allocator *locale;
  basic_message<char> *in_stack_ffffffffffffff18;
  allocator local_d1;
  string local_d0 [192];
  string *local_10;
  
  pbVar1 = in_RDI;
  local_10 = in_RSI;
  basic_message<char>::basic_message
            (in_stack_ffffffffffffff00,(char_type *)in_RDI,(char_type *)in_RDI,
             in_stack_fffffffffffffeec);
  locale = &local_d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,(char *)local_10,locale);
  basic_message<char>::str(in_stack_ffffffffffffff18,(locale *)locale,local_10);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  basic_message<char>::~basic_message(in_RDI);
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar1;
}

Assistant:

std::basic_string<CharType>  dngettext( char const *domain,
                                                CharType const *s,
                                                CharType const *p,
                                                int n,
                                                std::locale const &loc=std::locale())
        {
            return basic_message<CharType>(s,p,n).str(loc,domain);
        }